

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O1

PaSampleFormat
PaUtil_SelectClosestAvailableFormat(PaSampleFormat availableFormats,PaSampleFormat format)

{
  ulong uVar1;
  PaSampleFormat PVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = format & 0xffffffff7fffffff;
  uVar4 = availableFormats & 0xffffffff7fffffff;
  if ((uVar4 & format) != 0) {
    return uVar3;
  }
  uVar1 = uVar3;
  if (uVar3 == 1) {
    PVar2 = 0;
  }
  else {
    do {
      PVar2 = uVar1 >> 1;
      if (uVar1 < 2) break;
      uVar1 = PVar2;
    } while ((PVar2 & uVar4) == 0);
  }
  if (PVar2 != 0) {
    return PVar2;
  }
  do {
    uVar3 = uVar3 * 2;
    if (uVar3 == 0x10000) break;
  } while ((uVar3 & uVar4) == 0);
  PVar2 = 0xffffffffffffd8f6;
  if ((uVar3 & uVar4) != 0) {
    PVar2 = uVar3;
  }
  return PVar2;
}

Assistant:

PaSampleFormat PaUtil_SelectClosestAvailableFormat(
        PaSampleFormat availableFormats, PaSampleFormat format )
{
    PaSampleFormat result;

    format &= ~paNonInterleaved;
    availableFormats &= ~paNonInterleaved;

    if( (format & availableFormats) == 0 )
    {
        /* NOTE: this code depends on the sample format constants being in
            descending order of quality - ie best quality is 0
            FIXME: should write an assert which checks that all of the
            known constants conform to that requirement.
        */

        if( format != 0x01 )
        {
            /* scan for better formats */
            result = format;
            do
            {
                result >>= 1;
            }
            while( (result & availableFormats) == 0 && result != 0 );
        }
        else
        {
            result = 0;
        }

        if( result == 0 ){
            /* scan for worse formats */
            result = format;
            do
            {
                result <<= 1;
            }
            while( (result & availableFormats) == 0 && result != paCustomFormat );

            if( (result & availableFormats) == 0 )
                result = paSampleFormatNotSupported;
        }

    }else{
        result = format;
    }

    return result;
}